

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

int __thiscall QAbstractButtonPrivate::init(QAbstractButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  ControlType CVar1;
  QWidget *this_00;
  FocusPolicy policy;
  int extraout_EAX;
  QStyle *pQVar2;
  uint uVar3;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar2 = QWidget::style(this_00);
  policy = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x31,0,this_00,0);
  QWidget::setFocusPolicy(this_00,policy);
  CVar1 = this->controlType;
  if (CVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    if (CVar1 != 0) {
      for (; (CVar1 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
  }
  QWidget::setSizePolicy(this_00,(QSizePolicy)((uVar3 & 0x1f) << 0x18 | 0x10000));
  QWidget::setAttribute(this_00,WA_WState_OwnSizePolicy,false);
  QWidget::setForegroundRole(this_00,ButtonText);
  QWidget::setBackgroundRole(this_00,Button);
  return extraout_EAX;
}

Assistant:

void QAbstractButtonPrivate::init()
{
    Q_Q(QAbstractButton);

    q->setFocusPolicy(Qt::FocusPolicy(q->style()->styleHint(QStyle::SH_Button_FocusPolicy, nullptr, q)));
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed, controlType));
    q->setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    q->setForegroundRole(QPalette::ButtonText);
    q->setBackgroundRole(QPalette::Button);
}